

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86SUB(uchar *stream,x86Reg dst,int num)

{
  int iVar1;
  uchar uVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *start;
  int num_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  uVar3 = encodeRex(stream,false,rNONE,rNONE,dst);
  puVar4 = stream + uVar3;
  iVar1 = (int)stream;
  if ((char)num == num) {
    *puVar4 = 0x83;
    uVar2 = encodeRegister(dst,'\x05');
    puVar4[1] = uVar2;
    uVar3 = encodeImmByte(puVar4 + 2,(char)num);
    stream_local._4_4_ = ((int)(puVar4 + 2) + uVar3) - iVar1;
  }
  else if (dst == rEAX) {
    *puVar4 = '-';
    uVar3 = encodeImmDword(puVar4 + 1,num);
    stream_local._4_4_ = ((int)(puVar4 + 1) + uVar3) - iVar1;
  }
  else {
    *puVar4 = 0x81;
    uVar2 = encodeRegister(dst,'\x05');
    puVar4[1] = uVar2;
    uVar3 = encodeImmDword(puVar4 + 2,num);
    stream_local._4_4_ = ((int)(puVar4 + 2) + uVar3) - iVar1;
  }
  return stream_local._4_4_;
}

Assistant:

int x86SUB(unsigned char *stream, x86Reg dst, int num)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, rNONE, rNONE, dst);

	if((char)(num) == num)
	{
		*stream++ = 0x83;
		*stream++ = encodeRegister(dst, 5);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	if(dst == rEAX)
	{
		*stream++ = 0x2d;
		stream += encodeImmDword(stream, num);

		return int(stream - start);
	}

	*stream++ = 0x81;
	*stream++ = encodeRegister(dst, 5);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}